

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::operator~(SVInt *this)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 extraout_RDX;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar3;
  uint32_t i_1;
  uint32_t i;
  uint32_t words;
  SVInt *result;
  SVInt *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar4;
  uint local_2c;
  uint local_28;
  SVInt *in_stack_ffffffffffffffe0;
  
  aVar4 = in_RDI;
  SVInt((SVInt *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
        in_stack_ffffffffffffffa8);
  uVar2 = getNumWords((in_RSI->super_SVIntStorage).bitWidth,false);
  bVar1 = isSingleWord(in_RSI);
  if (bVar1) {
    *in_RDI.pVal = *in_RDI.pVal ^ 0xffffffffffffffff;
  }
  else {
    for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
      *(ulong *)(*in_RDI.pVal + (ulong)local_28 * 8) =
           *(ulong *)(*in_RDI.pVal + (ulong)local_28 * 8) ^ 0xffffffffffffffff;
    }
  }
  if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) != 0) {
    for (local_2c = 0; local_2c < uVar2; local_2c = local_2c + 1) {
      *(ulong *)(*in_RDI.pVal + (ulong)local_2c * 8) =
           (*(ulong *)(*in_RDI.pVal + (ulong)(local_2c + uVar2) * 8) ^ 0xffffffffffffffff) &
           *(ulong *)(*in_RDI.pVal + (ulong)local_2c * 8);
    }
  }
  clearUnusedBits(in_stack_ffffffffffffffe0);
  SVar3.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar3.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar3.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar3.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar3.super_SVIntStorage.field_0.val = aVar4.val;
  return (SVInt)SVar3.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator~() const {
    SVInt result(*this);
    uint32_t words = getNumWords(bitWidth, false);

    // just use xor to quickly flip everything
    if (isSingleWord())
        result.val ^= UINT64_MAX;
    else {
        for (uint32_t i = 0; i < words; i++)
            result.pVal[i] ^= UINT64_MAX;
    }

    if (unknownFlag) {
        // any unknown bits are still unknown, but we need to make sure
        // any high impedance values become X's
        for (uint32_t i = 0; i < words; i++)
            result.pVal[i] &= ~result.pVal[i + words];
    }

    result.clearUnusedBits();
    return result;
}